

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

Territory QLocalePrivate::codeToTerritory(QStringView code)

{
  char16_t cVar1;
  char16_t cVar2;
  QChar QVar3;
  QChar QVar4;
  qsizetype qVar5;
  char16_t *pcVar6;
  long in_FS_OFFSET;
  uchar *c;
  char16_t uc3;
  char16_t uc2;
  char16_t uc1;
  qsizetype len;
  undefined2 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb2;
  char16_t cVar7;
  undefined4 in_stack_ffffffffffffffb4;
  undefined2 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffba;
  undefined2 in_stack_ffffffffffffffbc;
  undefined2 in_stack_ffffffffffffffbe;
  byte *local_40;
  Territory local_26;
  QChar local_22;
  char16_t local_20;
  QChar local_1e;
  char16_t local_1c;
  QChar local_1a;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar5 = QStringView::size(&local_18);
  if ((qVar5 == 2) || (qVar5 == 3)) {
    QVar3 = QStringView::operator[]
                      ((QStringView *)
                       CONCAT26(in_stack_ffffffffffffffbe,
                                CONCAT24(in_stack_ffffffffffffffbc,
                                         CONCAT22(in_stack_ffffffffffffffba,
                                                  in_stack_ffffffffffffffb8))),
                       CONCAT44(in_stack_ffffffffffffffb4,
                                CONCAT22(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0)));
    local_1c = QVar3.ucs;
    local_1a = QChar::toUpper((QChar *)CONCAT44(in_stack_ffffffffffffffb4,
                                                CONCAT22(in_stack_ffffffffffffffb2,
                                                         in_stack_ffffffffffffffb0)));
    pcVar6 = QChar::unicode(&local_1a);
    cVar1 = *pcVar6;
    QVar4 = QStringView::operator[]
                      ((QStringView *)
                       CONCAT26(QVar3.ucs,
                                CONCAT24(in_stack_ffffffffffffffbc,
                                         CONCAT22(in_stack_ffffffffffffffba,
                                                  in_stack_ffffffffffffffb8))),
                       CONCAT44(in_stack_ffffffffffffffb4,
                                CONCAT22(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0)));
    local_20 = QVar4.ucs;
    local_1e = QChar::toUpper((QChar *)CONCAT44(in_stack_ffffffffffffffb4,
                                                CONCAT22(in_stack_ffffffffffffffb2,
                                                         in_stack_ffffffffffffffb0)));
    pcVar6 = QChar::unicode(&local_1e);
    cVar2 = *pcVar6;
    if (qVar5 < 3) {
      cVar7 = L'\0';
    }
    else {
      QStringView::operator[]
                ((QStringView *)
                 CONCAT26(QVar3.ucs,
                          CONCAT24(QVar4.ucs,
                                   CONCAT22(in_stack_ffffffffffffffba,in_stack_ffffffffffffffb8))),
                 CONCAT44(in_stack_ffffffffffffffb4,
                          CONCAT22(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0)));
      local_22 = QChar::toUpper((QChar *)CONCAT44(in_stack_ffffffffffffffb4,
                                                  CONCAT22(in_stack_ffffffffffffffb2,
                                                           in_stack_ffffffffffffffb0)));
      pcVar6 = QChar::unicode(&local_22);
      cVar7 = *pcVar6;
    }
    for (local_40 = "ZZ"; *local_40 != 0; local_40 = local_40 + 3) {
      if (((cVar1 == (ushort)*local_40) && (cVar2 == (ushort)local_40[1])) &&
         (cVar7 == (ushort)local_40[2])) {
        local_26 = (Territory)((long)(local_40 + -0x940df0) / 3);
        goto LAB_004c5ade;
      }
    }
    local_26 = AnyCountry;
  }
  else {
    local_26 = AnyCountry;
  }
LAB_004c5ade:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_26;
  }
  __stack_chk_fail();
}

Assistant:

QLocale::Territory QLocalePrivate::codeToTerritory(QStringView code) noexcept
{
    const auto len = code.size();
    if (len != 2 && len != 3)
        return QLocale::AnyTerritory;

    char16_t uc1 = code[0].toUpper().unicode();
    char16_t uc2 = code[1].toUpper().unicode();
    char16_t uc3 = len > 2 ? code[2].toUpper().unicode() : 0;

    const unsigned char *c = territory_code_list;
    for (; *c != 0; c += 3) {
        if (uc1 == c[0] && uc2 == c[1] && uc3 == c[2])
            return QLocale::Territory((c - territory_code_list)/3);
    }

    return QLocale::AnyTerritory;
}